

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

int gray_convert_glyph(PWorker worker)

{
  long lVar1;
  TBand *pTVar2;
  TBand *pTVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  int iVar6;
  long *plVar7;
  ulong uVar8;
  TBand *pTVar9;
  int local_30c;
  int cell_mod;
  int cell_end;
  int cell_start;
  int yindex;
  PCell_conflict cells_max;
  int error;
  TPos middle;
  TPos top;
  TPos bottom;
  int skip;
  PVG_FT_BBox *clip;
  TPos max_y;
  TPos max;
  TPos min;
  int num_bands;
  int n;
  TBand *band;
  TBand bands [40];
  PWorker worker_local;
  
  worker->num_gray_spans = 0;
  bands[0x27].max = (TPos)worker;
  gray_compute_cbox(worker);
  plVar7 = (long *)(bands[0x27].max + 0xa8);
  if ((((*plVar7 < *(long *)(bands[0x27].max + 0x18)) &&
       (*(long *)(bands[0x27].max + 0x10) < *(long *)(bands[0x27].max + 0xb8))) &&
      (*(long *)(bands[0x27].max + 0xb0) < *(long *)(bands[0x27].max + 0x28))) &&
     (*(long *)(bands[0x27].max + 0x20) < *(long *)(bands[0x27].max + 0xc0))) {
    if (*(long *)(bands[0x27].max + 0x10) < *plVar7) {
      *(long *)(bands[0x27].max + 0x10) = *plVar7;
    }
    if (*(long *)(bands[0x27].max + 0x20) < *(long *)(bands[0x27].max + 0xb0)) {
      *(undefined8 *)(bands[0x27].max + 0x20) = *(undefined8 *)(bands[0x27].max + 0xb0);
    }
    if (*(long *)(bands[0x27].max + 0xb8) < *(long *)(bands[0x27].max + 0x18)) {
      *(undefined8 *)(bands[0x27].max + 0x18) = *(undefined8 *)(bands[0x27].max + 0xb8);
    }
    if (*(long *)(bands[0x27].max + 0xc0) < *(long *)(bands[0x27].max + 0x28)) {
      *(undefined8 *)(bands[0x27].max + 0x28) = *(undefined8 *)(bands[0x27].max + 0xc0);
    }
    *(long *)(bands[0x27].max + 0x30) =
         *(long *)(bands[0x27].max + 0x18) - *(long *)(bands[0x27].max + 0x10);
    *(long *)(bands[0x27].max + 0x38) =
         *(long *)(bands[0x27].max + 0x28) - *(long *)(bands[0x27].max + 0x20);
    min._0_4_ = (int)((*(long *)(bands[0x27].max + 0x28) - *(long *)(bands[0x27].max + 0x20)) /
                     (long)*(int *)(bands[0x27].max + 0x10e0));
    if ((int)min == 0) {
      min._0_4_ = 1;
    }
    if (0x26 < (int)min) {
      min._0_4_ = 0x27;
    }
    *(undefined4 *)(bands[0x27].max + 0x10e4) = 0;
    max = *(TPos *)(bands[0x27].max + 0x20);
    lVar1 = *(long *)(bands[0x27].max + 0x28);
    for (min._4_4_ = 0; min._4_4_ < (int)min; min._4_4_ = min._4_4_ + 1) {
      max_y = max + *(int *)(bands[0x27].max + 0x10e0);
      if ((min._4_4_ == (int)min + -1) || (lVar1 < max_y)) {
        max_y = lVar1;
      }
      band = (TBand *)max;
      bands[0].min = max_y;
      _num_bands = &band;
      while (&band <= _num_bands) {
        *(undefined8 *)(bands[0x27].max + 0x11c0) = *(undefined8 *)(bands[0x27].max + 0x11b0);
        *(long *)(bands[0x27].max + 0x11c8) = (long)_num_bands[1] - (long)*_num_bands;
        cell_mod = (int)(*(long *)(bands[0x27].max + 0x11c8) << 3);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (long)cell_mod;
        iVar6 = SUB164(auVar4 % ZEXT816(0x18),0);
        if (iVar6 != 0) {
          cell_mod = cell_mod + (0x18 - iVar6);
        }
        iVar6 = (int)*(undefined8 *)(bands[0x27].max + 0x11b8);
        auVar5._8_4_ = 0;
        auVar5._0_8_ = (long)iVar6;
        uVar8 = *(long *)(bands[0x27].max + 0x11b0) +
                (long)(iVar6 - SUB124(auVar5 % ZEXT812(0x18),0));
        *(long *)(bands[0x27].max + 0x50) = *(long *)(bands[0x27].max + 0x11b0) + (long)cell_mod;
        if ((*(ulong *)(bands[0x27].max + 0x50) < uVar8) &&
           (*(long *)(bands[0x27].max + 0x58) =
                 (long)(int)((long)(uVar8 - *(long *)(bands[0x27].max + 0x50)) / 0x18),
           1 < *(long *)(bands[0x27].max + 0x58))) {
          for (cell_end = 0; (long)cell_end < *(long *)(bands[0x27].max + 0x11c8);
              cell_end = cell_end + 1) {
            *(undefined8 *)(*(long *)(bands[0x27].max + 0x11c0) + (long)cell_end * 8) = 0;
          }
          *(undefined8 *)(bands[0x27].max + 0x60) = 0;
          *(undefined4 *)(bands[0x27].max + 0x4c) = 1;
          *(TBand **)(bands[0x27].max + 0x20) = *_num_bands;
          *(TBand **)(bands[0x27].max + 0x28) = _num_bands[1];
          *(long *)(bands[0x27].max + 0x38) = (long)_num_bands[1] - (long)*_num_bands;
          iVar6 = gray_convert_glyph_inner((PWorker)bands[0x27].max);
          if (iVar6 != 0) {
            if (iVar6 != -4) {
              return 1;
            }
            goto LAB_00180ad6;
          }
          gray_sweep((PWorker)bands[0x27].max);
          _num_bands = _num_bands + -2;
        }
        else {
LAB_00180ad6:
          pTVar2 = *_num_bands;
          pTVar3 = _num_bands[1];
          pTVar9 = (TBand *)((long)&pTVar2->min + ((long)pTVar3 - (long)pTVar2 >> 1));
          if (pTVar9 == pTVar2) {
            return -6;
          }
          if ((long)*(int *)(bands[0x27].max + 0x10e0) <= (long)pTVar2 - (long)pTVar3) {
            *(int *)(bands[0x27].max + 0x10e4) = *(int *)(bands[0x27].max + 0x10e4) + 1;
          }
          _num_bands[2] = pTVar2;
          _num_bands[3] = pTVar9;
          *_num_bands = pTVar9;
          _num_bands[1] = pTVar3;
          _num_bands = _num_bands + 2;
        }
      }
      max = max_y;
    }
    if ((*(long *)(bands[0x27].max + 0x10d0) != 0) &&
       (*(int *)(bands[0x27].max + 0x10cc) < *(int *)(bands[0x27].max + 0x10c8))) {
      if (*(int *)(bands[0x27].max + 0x10cc) < 1) {
        local_30c = 0;
      }
      else {
        local_30c = *(int *)(bands[0x27].max + 0x10cc);
      }
      (**(code **)(bands[0x27].max + 0x10d0))
                (*(int *)(bands[0x27].max + 0x10c8) - local_30c,
                 bands[0x27].max + 200 + (long)local_30c * 0x10,
                 *(undefined8 *)(bands[0x27].max + 0x10d8));
    }
    *(int *)(bands[0x27].max + 0x10cc) =
         *(int *)(bands[0x27].max + 0x10cc) - *(int *)(bands[0x27].max + 0x10c8);
    if ((8 < *(int *)(bands[0x27].max + 0x10e4)) && (0x10 < *(int *)(bands[0x27].max + 0x10e0))) {
      *(int *)(bands[0x27].max + 0x10e0) = *(int *)(bands[0x27].max + 0x10e0) / 2;
    }
  }
  return 0;
}

Assistant:

static int
  gray_convert_glyph( RAS_ARG )
  {
    TBand            bands[40];
    TBand* volatile  band;
    int volatile     n, num_bands;
    TPos volatile    min, max, max_y;
    PVG_FT_BBox*      clip;
    int              skip;

    ras.num_gray_spans = 0;

    /* Set up state in the raster object */
    gray_compute_cbox( RAS_VAR );

    /* clip to target bitmap, exit if nothing to do */
    clip = &ras.clip_box;

    if ( ras.max_ex <= clip->xMin || ras.min_ex >= clip->xMax ||
         ras.max_ey <= clip->yMin || ras.min_ey >= clip->yMax )
      return 0;

    if ( ras.min_ex < clip->xMin ) ras.min_ex = clip->xMin;
    if ( ras.min_ey < clip->yMin ) ras.min_ey = clip->yMin;

    if ( ras.max_ex > clip->xMax ) ras.max_ex = clip->xMax;
    if ( ras.max_ey > clip->yMax ) ras.max_ey = clip->yMax;

    ras.count_ex = ras.max_ex - ras.min_ex;
    ras.count_ey = ras.max_ey - ras.min_ey;

    /* set up vertical bands */
    num_bands = (int)( ( ras.max_ey - ras.min_ey ) / ras.band_size );
    if ( num_bands == 0 )
      num_bands = 1;
    if ( num_bands >= 39 )
      num_bands = 39;

    ras.band_shoot = 0;

    min   = ras.min_ey;
    max_y = ras.max_ey;

    for ( n = 0; n < num_bands; n++, min = max )
    {
      max = min + ras.band_size;
      if ( n == num_bands - 1 || max > max_y )
        max = max_y;

      bands[0].min = min;
      bands[0].max = max;
      band         = bands;

      while ( band >= bands )
      {
        TPos  bottom, top, middle;
        int   error;

        {
          PCell  cells_max;
          int    yindex;
          int    cell_start, cell_end, cell_mod;


          ras.ycells = (PCell*)ras.buffer;
          ras.ycount = band->max - band->min;

          cell_start = sizeof ( PCell ) * ras.ycount;
          cell_mod   = cell_start % sizeof ( TCell );
          if ( cell_mod > 0 )
            cell_start += sizeof ( TCell ) - cell_mod;

          cell_end  = ras.buffer_size;
          cell_end -= cell_end % sizeof( TCell );

          cells_max = (PCell)( (char*)ras.buffer + cell_end );
          ras.cells = (PCell)( (char*)ras.buffer + cell_start );
          if ( ras.cells >= cells_max )
            goto ReduceBands;

          ras.max_cells = (int)(cells_max - ras.cells);
          if ( ras.max_cells < 2 )
            goto ReduceBands;

          for ( yindex = 0; yindex < ras.ycount; yindex++ )
            ras.ycells[yindex] = NULL;
        }

        ras.num_cells = 0;
        ras.invalid   = 1;
        ras.min_ey    = band->min;
        ras.max_ey    = band->max;
        ras.count_ey  = band->max - band->min;

        error = gray_convert_glyph_inner( RAS_VAR );

        if ( !error )
        {
          gray_sweep( RAS_VAR);
          band--;
          continue;
        }
        else if ( error != ErrRaster_Memory_Overflow )
          return 1;

      ReduceBands:
        /* render pool overflow; we will reduce the render band by half */
        bottom = band->min;
        top    = band->max;
        middle = bottom + ( ( top - bottom ) >> 1 );

        /* This is too complex for a single scanline; there must */
        /* be some problems.                                     */
        if ( middle == bottom )
        {
          return ErrRaster_OutOfMemory;
        }

        if ( bottom-top >= ras.band_size )
          ras.band_shoot++;

        band[1].min = bottom;
        band[1].max = middle;
        band[0].min = middle;
        band[0].max = top;
        band++;
      }
    }

    if ( ras.render_span && ras.num_gray_spans > ras.skip_spans )
    {
        skip = ras.skip_spans > 0 ? ras.skip_spans : 0;
        ras.render_span( ras.num_gray_spans - skip,
                         ras.gray_spans + skip,
                         ras.render_span_data );
    }

    ras.skip_spans -= ras.num_gray_spans;

    if ( ras.band_shoot > 8 && ras.band_size > 16 )
      ras.band_size = ras.band_size / 2;

    return 0;
  }